

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGImpactQuantizedBvh.h
# Opt level: O2

void __thiscall
btQuantizedBvhTree::getNodeBound(btQuantizedBvhTree *this,int nodeindex,btAABB *bound)

{
  btVector3 bVar1;
  
  bVar1 = bt_unquantize((unsigned_short *)(*(long *)(this + 0x18) + (long)nodeindex * 0x10),
                        (btVector3 *)(this + 0x28),(btVector3 *)(this + 0x48));
  *&(bound->m_min).m_floats = bVar1.m_floats;
  bVar1 = bt_unquantize((unsigned_short *)(*(long *)(this + 0x18) + (long)nodeindex * 0x10 + 6),
                        (btVector3 *)(this + 0x28),(btVector3 *)(this + 0x48));
  *&(bound->m_max).m_floats = bVar1.m_floats;
  return;
}

Assistant:

SIMD_FORCE_INLINE void getNodeBound(int nodeindex, btAABB & bound) const
	{
		bound.m_min = bt_unquantize(
			m_node_array[nodeindex].m_quantizedAabbMin,
			m_global_bound.m_min,m_bvhQuantization);

		bound.m_max = bt_unquantize(
			m_node_array[nodeindex].m_quantizedAabbMax,
			m_global_bound.m_min,m_bvhQuantization);
	}